

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ShowMetricsWindow(bool *p_open)

{
  int *piVar1;
  ImGuiMetricsConfig *p_open_00;
  bool *pbVar2;
  float fVar3;
  float fVar4;
  ImGuiWindow *pIVar5;
  ImGuiWindow **ppIVar6;
  ImGuiViewportP *pIVar7;
  ImGuiPopupData *pIVar8;
  undefined8 *puVar9;
  ImFontAtlas *atlas;
  ImGuiContext *pIVar10;
  ImGuiContext *pIVar11;
  undefined1 auVar12 [16];
  bool bVar13;
  ImGuiContext *g;
  ImGuiTable *pIVar14;
  ImDrawList *pIVar15;
  ImGuiWindow **ppIVar16;
  ImGuiWindow **__dest;
  ImGuiTabBar *tab_bar;
  int iVar17;
  ImU32 col;
  ImGuiContext *g_8;
  long lVar18;
  char *pcVar19;
  long lVar20;
  char *pcVar21;
  int rect_n;
  ulong uVar22;
  ImPool<ImGuiTable> *this;
  ImGuiWindowSettings *p;
  ImGuiTableSettings *settings;
  int n;
  int iVar23;
  undefined **ppuVar24;
  size_t __nmemb;
  char **ppcVar25;
  long lVar26;
  int iVar27;
  ImGuiWindow *window;
  ImVector<ImDrawList_*> *pIVar28;
  uint uVar29;
  ImPoolIdx IVar30;
  ImGuiContext *g_6;
  ulong uVar31;
  byte bVar32;
  float fVar33;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  float fVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  ImRect IVar43;
  ImVec2 local_1d8;
  int *local_1d0;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  int *local_1a8;
  ImVec2 local_1a0;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  char buf_1 [128];
  char *wrt_rects_names [8];
  char *trt_rects_names [13];
  
  pIVar10 = GImGui;
  bVar32 = 0;
  p_open_00 = &GImGui->DebugMetricsConfig;
  if ((GImGui->DebugMetricsConfig).ShowDebugLog == true) {
    ShowDebugLogWindow(&p_open_00->ShowDebugLog);
  }
  pbVar2 = &(pIVar10->DebugMetricsConfig).ShowStackTool;
  if ((pIVar10->DebugMetricsConfig).ShowStackTool == true) {
    ShowStackToolWindow(pbVar2);
  }
  bVar13 = Begin("Dear ImGui Metrics/Debugger",p_open,0);
  if ((!bVar13) ||
     (pIVar5 = GImGui->CurrentWindow, pIVar5->WriteAccessed = true, 1 < pIVar5->BeginCount)) {
    End();
    return;
  }
  Text("Dear ImGui %s","1.88");
  uVar35 = 0;
  uVar37 = 0;
  Text("Application average %.3f ms/frame (%.1f FPS)",
       SUB84((double)(1000.0 / (pIVar10->IO).Framerate),0));
  iVar23 = (pIVar10->IO).MetricsRenderIndices;
  Text("%d vertices, %d indices (%d triangles)",(ulong)(uint)(pIVar10->IO).MetricsRenderVertices,
       (long)iVar23,(ulong)(uint)(iVar23 / 3));
  Text("%d visible windows, %d active allocations",(ulong)(uint)(pIVar10->IO).MetricsRenderWindows,
       (ulong)(uint)(pIVar10->IO).MetricsActiveAllocations);
  Separator();
  wrt_rects_names[6] = "ContentIdeal";
  wrt_rects_names[7] = "ContentRegionRect";
  wrt_rects_names[4] = "WorkRect";
  wrt_rects_names[5] = "Content";
  wrt_rects_names[2] = "InnerRect";
  wrt_rects_names[3] = "InnerClipRect";
  wrt_rects_names[0] = "OuterRect";
  wrt_rects_names[1] = "OuterRectClipped";
  ppuVar24 = &PTR_anon_var_dwarf_c5a0b_001e4370;
  ppcVar25 = trt_rects_names;
  for (lVar18 = 0xd; lVar18 != 0; lVar18 = lVar18 + -1) {
    *ppcVar25 = *ppuVar24;
    ppuVar24 = ppuVar24 + (ulong)bVar32 * -2 + 1;
    ppcVar25 = ppcVar25 + (ulong)bVar32 * -2 + 1;
  }
  local_1a8 = &(pIVar10->DebugMetricsConfig).ShowWindowsRectsType;
  if ((pIVar10->DebugMetricsConfig).ShowWindowsRectsType < 0) {
    *local_1a8 = 4;
  }
  local_1d0 = &(pIVar10->DebugMetricsConfig).ShowTablesRectsType;
  if ((pIVar10->DebugMetricsConfig).ShowTablesRectsType < 0) {
    *local_1d0 = 2;
  }
  bVar13 = TreeNode("Tools");
  if (bVar13) {
    bVar13 = TreeNode("UTF-8 Encoding viewer");
    pIVar5 = GImGui->CurrentWindow;
    if (pIVar5->SkipItems == false) {
      (pIVar5->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar5->DC).CursorPosPrevLine.x;
      (pIVar5->DC).CursorPos.y = (pIVar5->DC).CursorPosPrevLine.y;
      (pIVar5->DC).CurrLineSize = (pIVar5->DC).PrevLineSize;
      (pIVar5->DC).CurrLineTextBaseOffset = (pIVar5->DC).PrevLineTextBaseOffset;
      (pIVar5->DC).IsSameLine = true;
    }
    MetricsHelpMarker(
                     "You can also call ImGui::DebugTextEncoding() from your code with a given string to test that your UTF-8 encoding settings are correct."
                     );
    pIVar11 = GImGui;
    if (bVar13) {
      (GImGui->NextItemData).Flags = (GImGui->NextItemData).Flags | 1;
      (pIVar11->NextItemData).Width = -1.1754944e-38;
      InputText("##Text",ShowMetricsWindow::buf,100,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
      if (ShowMetricsWindow::buf[0] != '\0') {
        DebugTextEncoding(ShowMetricsWindow::buf);
      }
      TreePop();
    }
    bVar13 = Checkbox("Show Item Picker",&pIVar10->DebugItemPickerActive);
    if ((bVar13) && (pIVar10->DebugItemPickerActive == true)) {
      GImGui->DebugItemPickerActive = true;
    }
    pIVar5 = GImGui->CurrentWindow;
    if (pIVar5->SkipItems == false) {
      (pIVar5->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar5->DC).CursorPosPrevLine.x;
      (pIVar5->DC).CursorPos.y = (pIVar5->DC).CursorPosPrevLine.y;
      (pIVar5->DC).CurrLineSize = (pIVar5->DC).PrevLineSize;
      (pIVar5->DC).CurrLineTextBaseOffset = (pIVar5->DC).PrevLineTextBaseOffset;
      (pIVar5->DC).IsSameLine = true;
    }
    MetricsHelpMarker(
                     "Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don\'t have a debugger attached, this will probably crash."
                     );
    Checkbox("Show Debug Log",&p_open_00->ShowDebugLog);
    pIVar5 = GImGui->CurrentWindow;
    if (pIVar5->SkipItems == false) {
      (pIVar5->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar5->DC).CursorPosPrevLine.x;
      (pIVar5->DC).CursorPos.y = (pIVar5->DC).CursorPosPrevLine.y;
      (pIVar5->DC).CurrLineSize = (pIVar5->DC).PrevLineSize;
      (pIVar5->DC).CurrLineTextBaseOffset = (pIVar5->DC).PrevLineTextBaseOffset;
      (pIVar5->DC).IsSameLine = true;
    }
    MetricsHelpMarker("You can also call ImGui::ShowDebugLogWindow() from your code.");
    Checkbox("Show Stack Tool",pbVar2);
    pIVar5 = GImGui->CurrentWindow;
    if (pIVar5->SkipItems == false) {
      (pIVar5->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar5->DC).CursorPosPrevLine.x;
      (pIVar5->DC).CursorPos.y = (pIVar5->DC).CursorPosPrevLine.y;
      (pIVar5->DC).CurrLineSize = (pIVar5->DC).PrevLineSize;
      (pIVar5->DC).CurrLineTextBaseOffset = (pIVar5->DC).PrevLineTextBaseOffset;
      (pIVar5->DC).IsSameLine = true;
    }
    MetricsHelpMarker("You can also call ImGui::ShowStackToolWindow() from your code.");
    Checkbox("Show windows begin order",&(pIVar10->DebugMetricsConfig).ShowWindowsBeginOrder);
    pbVar2 = &(pIVar10->DebugMetricsConfig).ShowWindowsRects;
    Checkbox("Show windows rectangles",pbVar2);
    pIVar11 = GImGui;
    pIVar5 = GImGui->CurrentWindow;
    if (pIVar5->SkipItems == false) {
      (pIVar5->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar5->DC).CursorPosPrevLine.x;
      (pIVar5->DC).CursorPos.y = (pIVar5->DC).CursorPosPrevLine.y;
      (pIVar5->DC).CurrLineSize = (pIVar5->DC).PrevLineSize;
      (pIVar5->DC).CurrLineTextBaseOffset = (pIVar5->DC).PrevLineTextBaseOffset;
      (pIVar5->DC).IsSameLine = true;
    }
    fVar33 = pIVar11->FontSize;
    *(byte *)&(pIVar11->NextItemData).Flags = (byte)(pIVar11->NextItemData).Flags | 1;
    (pIVar11->NextItemData).Width = fVar33 * 12.0;
    bVar13 = Combo("##show_windows_rect_type",local_1a8,wrt_rects_names,8,8);
    *pbVar2 = (bool)(*pbVar2 | bVar13);
    if ((*pbVar2 != false) && (pIVar10->NavWindow != (ImGuiWindow *)0x0)) {
      lVar18 = 0;
      BulletText("\'%s\':",pIVar10->NavWindow->Name);
      pIVar11 = GImGui;
      pIVar5 = GImGui->CurrentWindow;
      pIVar5->WriteAccessed = true;
      fVar33 = (pIVar11->Style).IndentSpacing + (pIVar5->DC).Indent.x;
      (pIVar5->DC).Indent.x = fVar33;
      (pIVar5->DC).CursorPos.x = fVar33 + (pIVar5->Pos).x + (pIVar5->DC).ColumnsOffset.x;
      do {
        IVar43 = ShowMetricsWindow::Funcs::GetWindowRect(pIVar10->NavWindow,(int)lVar18);
        uVar35 = 0;
        uVar37 = 0;
        Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",SUB84((double)IVar43.Min.x,0),
             (double)IVar43.Min.y,SUB84((double)IVar43.Max.x,0),(double)IVar43.Max.y,
             SUB84((double)(IVar43.Max.x - IVar43.Min.x),0),
             SUB84((double)(IVar43.Max.y - IVar43.Min.y),0),wrt_rects_names[lVar18]);
        pIVar11 = GImGui;
        lVar18 = lVar18 + 1;
      } while (lVar18 != 8);
      pIVar5 = GImGui->CurrentWindow;
      pIVar5->WriteAccessed = true;
      fVar33 = (pIVar5->DC).Indent.x - (pIVar11->Style).IndentSpacing;
      (pIVar5->DC).Indent.x = fVar33;
      (pIVar5->DC).CursorPos.x = fVar33 + (pIVar5->Pos).x + (pIVar5->DC).ColumnsOffset.x;
    }
    pbVar2 = &(pIVar10->DebugMetricsConfig).ShowTablesRects;
    Checkbox("Show tables rectangles",pbVar2);
    pIVar11 = GImGui;
    pIVar5 = GImGui->CurrentWindow;
    if (pIVar5->SkipItems == false) {
      (pIVar5->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar5->DC).CursorPosPrevLine.x;
      (pIVar5->DC).CursorPos.y = (pIVar5->DC).CursorPosPrevLine.y;
      (pIVar5->DC).CurrLineSize = (pIVar5->DC).PrevLineSize;
      (pIVar5->DC).CurrLineTextBaseOffset = (pIVar5->DC).PrevLineTextBaseOffset;
      (pIVar5->DC).IsSameLine = true;
    }
    fVar33 = pIVar11->FontSize;
    *(byte *)&(pIVar11->NextItemData).Flags = (byte)(pIVar11->NextItemData).Flags | 1;
    (pIVar11->NextItemData).Width = fVar33 * 12.0;
    bVar13 = Combo("##show_table_rects_type",local_1d0,trt_rects_names,0xd,0xd);
    *pbVar2 = (bool)(*pbVar2 | bVar13);
    if (((*pbVar2 != false) && (pIVar10->NavWindow != (ImGuiWindow *)0x0)) &&
       (0 < (pIVar10->Tables).Map.Data.Size)) {
      this = &pIVar10->Tables;
      IVar30 = 0;
      local_178._0_8_ = this;
      do {
        pIVar14 = ImPool<ImGuiTable>::TryGetMapData(this,IVar30);
        if ((pIVar14 != (ImGuiTable *)0x0) && (pIVar10->FrameCount + -1 <= pIVar14->LastFrameActive)
           ) {
          if ((pIVar14->OuterWindow == pIVar10->NavWindow) ||
             (pIVar14->InnerWindow == pIVar10->NavWindow)) {
            BulletText("Table 0x%08X (%d columns, in \'%s\')",(ulong)pIVar14->ID,
                       (ulong)(uint)pIVar14->ColumnsCount,pIVar14->OuterWindow->Name);
            bVar13 = IsItemHovered(0);
            if (bVar13) {
              pIVar15 = GetForegroundDrawList();
              auVar12 = buf_1._0_16_;
              buf_1._4_4_ = (pIVar14->OuterRect).Min.y + -1.0;
              buf_1._0_4_ = (pIVar14->OuterRect).Min.x + -1.0;
              buf_1._8_8_ = auVar12._8_8_;
              local_1d8.y = (pIVar14->OuterRect).Max.y + 1.0;
              local_1d8.x = (pIVar14->OuterRect).Max.x + 1.0;
              uVar35 = 0;
              uVar37 = 0;
              ImDrawList::AddRect(pIVar15,(ImVec2 *)buf_1,&local_1d8,0xff00ffff,0.0,0,2.0);
            }
            pIVar11 = GImGui;
            pIVar5 = GImGui->CurrentWindow;
            pIVar5->WriteAccessed = true;
            fVar33 = (pIVar11->Style).IndentSpacing + (pIVar5->DC).Indent.x;
            (pIVar5->DC).Indent.x = fVar33;
            (pIVar5->DC).CursorPos.x = fVar33 + (pIVar5->Pos).x + (pIVar5->DC).ColumnsOffset.x;
            uVar22 = 0;
            uVar36 = uVar35;
            uVar38 = uVar37;
            do {
              iVar23 = (int)uVar22;
              if (uVar22 < 6) {
                IVar43 = ShowMetricsWindow::Funcs::GetTableRect(pIVar14,iVar23,-1);
                local_198 = IVar43.Min.y;
                local_188 = IVar43.Max.y;
                uVar35 = 0;
                uVar37 = 0;
                local_1c8._8_4_ = uVar36;
                local_1c8._0_4_ = IVar43.Max.x;
                local_1c8._4_4_ = IVar43.Max.y;
                local_1c8._12_4_ = uVar38;
                local_1b8._8_4_ = extraout_XMM0_Dc_00;
                local_1b8._0_4_ = IVar43.Min.x;
                local_1b8._4_4_ = IVar43.Min.y;
                local_1b8._12_4_ = extraout_XMM0_Dd_00;
                fStack_194 = local_198;
                fStack_190 = local_198;
                fStack_18c = local_198;
                fStack_184 = local_188;
                fStack_180 = local_188;
                fStack_17c = local_188;
                ImFormatString(buf_1,0x80,"(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",
                               SUB84((double)IVar43.Min.x,0),(double)local_198,
                               SUB84((double)IVar43.Max.x,0),(double)local_188,
                               SUB84((double)(IVar43.Max.x - IVar43.Min.x),0),
                               SUB84((double)(local_188 - local_198),0),trt_rects_names[uVar22]);
                local_1d8.x = 0.0;
                local_1d8.y = 0.0;
                Selectable(buf_1,false,0,&local_1d8);
                bVar13 = IsItemHovered(0);
                if (bVar13) {
                  pIVar15 = GetForegroundDrawList();
                  local_1d8.x = (float)local_1b8._0_4_ + -1.0;
                  local_1d8.y = local_198 + -1.0;
                  local_1a0.x = (float)local_1c8._0_4_ + 1.0;
                  local_1a0.y = local_188 + 1.0;
                  uVar35 = 0;
                  uVar37 = 0;
                  ImDrawList::AddRect(pIVar15,&local_1d8,&local_1a0,0xff00ffff,0.0,0,2.0);
                }
              }
              else {
                uVar35 = uVar36;
                uVar37 = uVar38;
                if (((iVar23 == 8) || (iVar23 == 6)) && (0 < pIVar14->ColumnsCount)) {
                  uVar31 = 0;
                  do {
                    IVar43 = ShowMetricsWindow::Funcs::GetTableRect(pIVar14,iVar23,(int)uVar31);
                    local_198 = IVar43.Min.y;
                    local_188 = IVar43.Max.y;
                    uVar35 = 0;
                    uVar37 = 0;
                    local_1c8._8_4_ = uVar36;
                    local_1c8._0_4_ = IVar43.Max.x;
                    local_1c8._4_4_ = IVar43.Max.y;
                    local_1c8._12_4_ = uVar38;
                    local_1b8._8_4_ = extraout_XMM0_Dc;
                    local_1b8._0_4_ = IVar43.Min.x;
                    local_1b8._4_4_ = IVar43.Min.y;
                    local_1b8._12_4_ = extraout_XMM0_Dd;
                    fStack_194 = local_198;
                    fStack_190 = local_198;
                    fStack_18c = local_198;
                    fStack_184 = local_188;
                    fStack_180 = local_188;
                    fStack_17c = local_188;
                    ImFormatString(buf_1,0x80,
                                   "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) Col %d %s",
                                   SUB84((double)IVar43.Min.x,0),(double)local_198,
                                   SUB84((double)IVar43.Max.x,0),(double)local_188,
                                   SUB84((double)(IVar43.Max.x - IVar43.Min.x),0),
                                   SUB84((double)(local_188 - local_198),0),uVar31);
                    local_1d8.x = 0.0;
                    local_1d8.y = 0.0;
                    Selectable(buf_1,false,0,&local_1d8);
                    bVar13 = IsItemHovered(0);
                    if (bVar13) {
                      pIVar15 = GetForegroundDrawList();
                      local_1d8.x = (float)local_1b8._0_4_ + -1.0;
                      local_1d8.y = local_198 + -1.0;
                      local_1a0.x = (float)local_1c8._0_4_ + 1.0;
                      local_1a0.y = local_188 + 1.0;
                      uVar35 = 0;
                      uVar37 = 0;
                      ImDrawList::AddRect(pIVar15,&local_1d8,&local_1a0,0xff00ffff,0.0,0,2.0);
                    }
                    uVar29 = (int)uVar31 + 1;
                    uVar31 = (ulong)uVar29;
                    uVar36 = uVar35;
                    uVar38 = uVar37;
                  } while ((int)uVar29 < pIVar14->ColumnsCount);
                }
              }
              pIVar11 = GImGui;
              uVar22 = uVar22 + 1;
              uVar36 = uVar35;
              uVar38 = uVar37;
            } while (uVar22 != 0xd);
            pIVar5 = GImGui->CurrentWindow;
            pIVar5->WriteAccessed = true;
            fVar33 = (pIVar5->DC).Indent.x - (pIVar11->Style).IndentSpacing;
            (pIVar5->DC).Indent.x = fVar33;
            (pIVar5->DC).CursorPos.x = fVar33 + (pIVar5->Pos).x + (pIVar5->DC).ColumnsOffset.x;
            this = (ImPool<ImGuiTable> *)local_178._0_8_;
          }
        }
        IVar30 = IVar30 + 1;
      } while (IVar30 < (pIVar10->Tables).Map.Data.Size);
    }
    TreePop();
  }
  local_1c8._0_8_ = &pIVar10->Windows;
  uVar22 = 0;
  bVar13 = TreeNode("Windows","Windows (%d)",(ulong)(uint)(pIVar10->Windows).Size);
  if (bVar13) {
    DebugNodeWindowsList((ImVector<ImGuiWindow_*> *)local_1c8._0_8_,"By display order");
    DebugNodeWindowsList(&pIVar10->WindowsFocusOrder,"By focus order (root windows)");
    bVar13 = TreeNode("By submission order (begin stack)");
    if (bVar13) {
      iVar23 = (pIVar10->WindowsTempSortBuffer).Capacity;
      if (iVar23 < 0) {
        uVar29 = iVar23 / 2 + iVar23;
        uVar31 = 0;
        if (0 < (int)uVar29) {
          uVar31 = (ulong)uVar29;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        ppIVar16 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(uVar31 * 8,GImAllocatorUserData);
        ppIVar6 = (pIVar10->WindowsTempSortBuffer).Data;
        if (ppIVar6 != (ImGuiWindow **)0x0) {
          memcpy(ppIVar16,ppIVar6,(long)(pIVar10->WindowsTempSortBuffer).Size << 3);
          ppIVar6 = (pIVar10->WindowsTempSortBuffer).Data;
          if ((ppIVar6 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(ppIVar6,GImAllocatorUserData);
        }
        (pIVar10->WindowsTempSortBuffer).Data = ppIVar16;
        (pIVar10->WindowsTempSortBuffer).Capacity = (int)uVar31;
      }
      (pIVar10->WindowsTempSortBuffer).Size = 0;
      if (0 < (pIVar10->Windows).Size) {
        lVar18 = 0;
        do {
          ppIVar6 = (pIVar10->Windows).Data;
          if (pIVar10->FrameCount <= ppIVar6[lVar18]->LastFrameActive + 1) {
            iVar23 = (pIVar10->WindowsTempSortBuffer).Size;
            iVar27 = (pIVar10->WindowsTempSortBuffer).Capacity;
            if (iVar23 == iVar27) {
              if (iVar27 == 0) {
                iVar17 = 8;
              }
              else {
                iVar17 = iVar27 / 2 + iVar27;
              }
              iVar23 = iVar23 + 1;
              if (iVar23 < iVar17) {
                iVar23 = iVar17;
              }
              if (iVar27 < iVar23) {
                if (GImGui != (ImGuiContext *)0x0) {
                  piVar1 = &(GImGui->IO).MetricsActiveAllocations;
                  *piVar1 = *piVar1 + 1;
                }
                __dest = (ImGuiWindow **)
                         (*GImAllocatorAllocFunc)((long)iVar23 << 3,GImAllocatorUserData);
                ppIVar16 = (pIVar10->WindowsTempSortBuffer).Data;
                if (ppIVar16 != (ImGuiWindow **)0x0) {
                  memcpy(__dest,ppIVar16,(long)(pIVar10->WindowsTempSortBuffer).Size << 3);
                  ppIVar16 = (pIVar10->WindowsTempSortBuffer).Data;
                  if ((ppIVar16 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
                    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
                    *piVar1 = *piVar1 + -1;
                  }
                  (*GImAllocatorFreeFunc)(ppIVar16,GImAllocatorUserData);
                }
                (pIVar10->WindowsTempSortBuffer).Data = __dest;
                (pIVar10->WindowsTempSortBuffer).Capacity = iVar23;
              }
            }
            (pIVar10->WindowsTempSortBuffer).Data[(pIVar10->WindowsTempSortBuffer).Size] =
                 ppIVar6[lVar18];
            (pIVar10->WindowsTempSortBuffer).Size = (pIVar10->WindowsTempSortBuffer).Size + 1;
          }
          lVar18 = lVar18 + 1;
        } while (lVar18 < *(int *)local_1c8._0_8_);
      }
      __nmemb = (size_t)(pIVar10->WindowsTempSortBuffer).Size;
      if (1 < __nmemb) {
        qsort((pIVar10->WindowsTempSortBuffer).Data,__nmemb,8,
              ShowMetricsWindow::Func::WindowComparerByBeginOrder);
      }
      DebugNodeWindowsListByBeginStackParent
                ((pIVar10->WindowsTempSortBuffer).Data,(pIVar10->WindowsTempSortBuffer).Size,
                 (ImGuiWindow *)0x0);
      TreePop();
    }
    TreePop();
  }
  lVar18 = (long)(pIVar10->Viewports).Size;
  if (0 < lVar18) {
    lVar20 = 0;
    uVar22 = 0;
    do {
      lVar26 = 0;
      iVar23 = 0;
      do {
        iVar23 = iVar23 + *(int *)((long)&((pIVar10->Viewports).Data[lVar20]->DrawDataBuilder).
                                          Layers[0].Size + lVar26);
        lVar26 = lVar26 + 0x10;
      } while (lVar26 == 0x10);
      uVar22 = (ulong)(uint)((int)uVar22 + iVar23);
      lVar20 = lVar20 + 1;
    } while (lVar20 != lVar18);
  }
  bVar13 = TreeNode("DrawLists","DrawLists (%d)",uVar22);
  if (bVar13) {
    Checkbox("Show ImDrawCmd mesh when hovering",&(pIVar10->DebugMetricsConfig).ShowDrawCmdMesh);
    Checkbox("Show ImDrawCmd bounding boxes when hovering",
             &(pIVar10->DebugMetricsConfig).ShowDrawCmdBoundingBoxes);
    if (0 < (pIVar10->Viewports).Size) {
      lVar18 = 0;
      do {
        pIVar7 = (pIVar10->Viewports).Data[lVar18];
        lVar20 = 0;
        do {
          if (0 < (pIVar7->DrawDataBuilder).Layers[lVar20].Size) {
            pIVar28 = (pIVar7->DrawDataBuilder).Layers + lVar20;
            lVar26 = 0;
            do {
              DebugNodeDrawList((ImGuiWindow *)0x0,pIVar28->Data[lVar26],"DrawList");
              lVar26 = lVar26 + 1;
            } while (lVar26 < pIVar28->Size);
          }
          bVar13 = lVar20 == 0;
          lVar20 = lVar20 + 1;
        } while (bVar13);
        lVar18 = lVar18 + 1;
      } while (lVar18 < (pIVar10->Viewports).Size);
    }
    TreePop();
  }
  bVar13 = TreeNode("Viewports","Viewports (%d)",(ulong)(uint)(pIVar10->Viewports).Size);
  if (bVar13) {
    fVar33 = GetTreeNodeToLabelSpacing();
    pIVar11 = GImGui;
    pIVar5 = GImGui->CurrentWindow;
    pIVar5->WriteAccessed = true;
    if ((fVar33 == 0.0) && (!NAN(fVar33))) {
      fVar33 = (pIVar11->Style).IndentSpacing;
    }
    fVar33 = fVar33 + (pIVar5->DC).Indent.x;
    (pIVar5->DC).Indent.x = fVar33;
    fVar33 = fVar33 + (pIVar5->Pos).x + (pIVar5->DC).ColumnsOffset.x;
    (pIVar5->DC).CursorPos.x = fVar33;
    iVar23 = (pIVar11->Viewports).Size;
    if ((long)iVar23 < 1) {
      fVar41 = -3.4028235e+38;
      local_198 = 3.4028235e+38;
      fVar40 = 3.4028235e+38;
      fVar42 = -3.4028235e+38;
    }
    else {
      fVar40 = 3.4028235e+38;
      lVar18 = 0;
      local_198 = 3.4028235e+38;
      fVar34 = -3.4028235e+38;
      fVar39 = -3.4028235e+38;
      do {
        pIVar7 = (pIVar11->Viewports).Data[lVar18];
        fVar3 = (pIVar7->super_ImGuiViewport).Pos.x;
        fVar4 = (pIVar7->super_ImGuiViewport).Pos.y;
        fVar41 = (pIVar7->super_ImGuiViewport).Size.x + fVar3;
        if (fVar41 <= fVar39) {
          fVar41 = fVar39;
        }
        fVar42 = (pIVar7->super_ImGuiViewport).Size.y + fVar4;
        if (fVar42 <= fVar34) {
          fVar42 = fVar34;
        }
        if (local_198 <= fVar3) {
          fVar3 = local_198;
        }
        local_198 = fVar3;
        if (fVar40 <= fVar4) {
          fVar4 = fVar40;
        }
        fVar40 = fVar4;
        lVar18 = lVar18 + 1;
        fVar34 = fVar42;
        fVar39 = fVar41;
      } while (iVar23 != lVar18);
    }
    local_168 = ZEXT416((uint)fVar42);
    local_178 = ZEXT416((uint)fVar41);
    if (0 < iVar23) {
      local_188 = (pIVar5->DC).CursorPos.y - fVar40 * 0.125;
      fVar33 = fVar33 - local_198 * 0.125;
      lVar18 = 0;
      local_1b8._0_4_ = fVar33;
      do {
        pIVar7 = (pIVar11->Viewports).Data[lVar18];
        fVar41 = (pIVar7->super_ImGuiViewport).Pos.x;
        fVar42 = (pIVar7->super_ImGuiViewport).Pos.y;
        buf_1._4_4_ = fVar42 * 0.125 + local_188;
        buf_1._0_4_ = fVar41 * 0.125 + fVar33;
        buf_1._8_4_ = (fVar41 + (pIVar7->super_ImGuiViewport).Size.x) * 0.125 + fVar33;
        buf_1._12_4_ = (fVar42 + (pIVar7->super_ImGuiViewport).Size.y) * 0.125 + local_188;
        DebugRenderViewportThumbnail(pIVar5->DrawList,pIVar7,(ImRect *)buf_1);
        lVar18 = lVar18 + 1;
        fVar33 = (float)local_1b8._0_4_;
      } while (lVar18 < (pIVar11->Viewports).Size);
    }
    buf_1._4_4_ = ((float)local_168._0_4_ - fVar40) * 0.125;
    buf_1._0_4_ = ((float)local_178._0_4_ - local_198) * 0.125;
    Dummy((ImVec2 *)buf_1);
    fVar33 = GetTreeNodeToLabelSpacing();
    pIVar11 = GImGui;
    pIVar5 = GImGui->CurrentWindow;
    pIVar5->WriteAccessed = true;
    if ((fVar33 == 0.0) && (!NAN(fVar33))) {
      fVar33 = (pIVar11->Style).IndentSpacing;
    }
    fVar33 = (pIVar5->DC).Indent.x - fVar33;
    (pIVar5->DC).Indent.x = fVar33;
    (pIVar5->DC).CursorPos.x = fVar33 + (pIVar5->Pos).x + (pIVar5->DC).ColumnsOffset.x;
    if (0 < (pIVar10->Viewports).Size) {
      lVar18 = 0;
      do {
        DebugNodeViewport((pIVar10->Viewports).Data[lVar18]);
        lVar18 = lVar18 + 1;
      } while (lVar18 < (pIVar10->Viewports).Size);
    }
    TreePop();
  }
  bVar13 = TreeNode("Popups","Popups (%d)",(ulong)(uint)(pIVar10->OpenPopupStack).Size);
  if (bVar13) {
    if (0 < (pIVar10->OpenPopupStack).Size) {
      lVar20 = 8;
      lVar18 = 0;
      do {
        pIVar8 = (pIVar10->OpenPopupStack).Data;
        puVar9 = *(undefined8 **)((long)&pIVar8->PopupId + lVar20);
        pcVar21 = "NULL";
        if (puVar9 != (undefined8 *)0x0) {
          pcVar21 = (char *)*puVar9;
        }
        pcVar19 = "";
        if ((puVar9 != (undefined8 *)0x0) &&
           (pcVar19 = " ChildWindow", (*(byte *)((long)puVar9 + 0xf) & 1) == 0)) {
          pcVar19 = "";
        }
        BulletText("PopupID: %08x, Window: \'%s\'%s%s",(ulong)*(uint *)((long)pIVar8 + lVar20 + -8),
                   pcVar21,pcVar19);
        lVar18 = lVar18 + 1;
        lVar20 = lVar20 + 0x38;
      } while (lVar18 < (pIVar10->OpenPopupStack).Size);
    }
    TreePop();
  }
  bVar13 = TreeNode("TabBars","Tab Bars (%d)",(ulong)(uint)(pIVar10->TabBars).AliveCount);
  if (bVar13) {
    if (0 < (pIVar10->TabBars).Map.Data.Size) {
      IVar30 = 0;
      do {
        tab_bar = ImPool<ImGuiTabBar>::TryGetMapData(&pIVar10->TabBars,IVar30);
        if (tab_bar != (ImGuiTabBar *)0x0) {
          PushID(tab_bar);
          DebugNodeTabBar(tab_bar,"TabBar");
          PopID();
        }
        IVar30 = IVar30 + 1;
      } while (IVar30 < (pIVar10->TabBars).Map.Data.Size);
    }
    TreePop();
  }
  bVar13 = TreeNode("Tables","Tables (%d)",(ulong)(uint)(pIVar10->Tables).AliveCount);
  if (bVar13) {
    if (0 < (pIVar10->Tables).Map.Data.Size) {
      iVar23 = 0;
      do {
        pIVar14 = ImPool<ImGuiTable>::TryGetMapData(&pIVar10->Tables,iVar23);
        if (pIVar14 != (ImGuiTable *)0x0) {
          DebugNodeTable(pIVar14);
        }
        iVar23 = iVar23 + 1;
      } while (iVar23 < (pIVar10->Tables).Map.Data.Size);
    }
    TreePop();
  }
  atlas = (pIVar10->IO).Fonts;
  bVar13 = TreeNode("Fonts","Fonts (%d)",(ulong)(uint)(atlas->Fonts).Size);
  if (bVar13) {
    ShowFontAtlas(atlas);
    TreePop();
  }
  bVar13 = TreeNode("InputText");
  if (bVar13) {
    DebugNodeInputTextState(&pIVar10->InputTextState);
    TreePop();
  }
  bVar13 = TreeNode("Settings");
  if (bVar13) {
    bVar13 = SmallButton("Clear");
    if (bVar13) {
      ClearIniSettings();
    }
    pIVar5 = GImGui->CurrentWindow;
    if (pIVar5->SkipItems == false) {
      (pIVar5->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar5->DC).CursorPosPrevLine.x;
      (pIVar5->DC).CursorPos.y = (pIVar5->DC).CursorPosPrevLine.y;
      (pIVar5->DC).CurrLineSize = (pIVar5->DC).PrevLineSize;
      (pIVar5->DC).CurrLineTextBaseOffset = (pIVar5->DC).PrevLineTextBaseOffset;
      (pIVar5->DC).IsSameLine = true;
    }
    bVar13 = SmallButton("Save to memory");
    if (bVar13) {
      SaveIniSettingsToMemory((size_t *)0x0);
    }
    pIVar5 = GImGui->CurrentWindow;
    if (pIVar5->SkipItems == false) {
      (pIVar5->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar5->DC).CursorPosPrevLine.x;
      (pIVar5->DC).CursorPos.y = (pIVar5->DC).CursorPosPrevLine.y;
      (pIVar5->DC).CurrLineSize = (pIVar5->DC).PrevLineSize;
      (pIVar5->DC).CurrLineTextBaseOffset = (pIVar5->DC).PrevLineTextBaseOffset;
      (pIVar5->DC).IsSameLine = true;
    }
    bVar13 = SmallButton("Save to disk");
    if (bVar13) {
      SaveIniSettingsToDisk((pIVar10->IO).IniFilename);
    }
    pIVar5 = GImGui->CurrentWindow;
    if (pIVar5->SkipItems == false) {
      (pIVar5->DC).CursorPos.x = (GImGui->Style).ItemSpacing.x + (pIVar5->DC).CursorPosPrevLine.x;
      (pIVar5->DC).CursorPos.y = (pIVar5->DC).CursorPosPrevLine.y;
      (pIVar5->DC).CurrLineSize = (pIVar5->DC).PrevLineSize;
      (pIVar5->DC).CurrLineTextBaseOffset = (pIVar5->DC).PrevLineTextBaseOffset;
      (pIVar5->DC).IsSameLine = true;
    }
    if ((pIVar10->IO).IniFilename == (char *)0x0) {
      TextUnformatted("<NULL>",(char *)0x0);
    }
    else {
      Text("\"%s\"");
    }
    Text("SettingsDirtyTimer %.2f",SUB84((double)pIVar10->SettingsDirtyTimer,0));
    bVar13 = TreeNode("SettingsHandlers","Settings handlers: (%d)",
                      (ulong)(uint)(pIVar10->SettingsHandlers).Size);
    if (bVar13) {
      if (0 < (pIVar10->SettingsHandlers).Size) {
        lVar18 = 0;
        lVar20 = 0;
        do {
          BulletText("%s",*(undefined8 *)
                           ((long)&((pIVar10->SettingsHandlers).Data)->TypeName + lVar18));
          lVar20 = lVar20 + 1;
          lVar18 = lVar18 + 0x48;
        } while (lVar20 < (pIVar10->SettingsHandlers).Size);
      }
      TreePop();
    }
    bVar13 = TreeNode("SettingsWindows","Settings packed data: Windows: %d bytes",
                      (ulong)(uint)(pIVar10->SettingsWindows).Buf.Size);
    if (bVar13) {
      pcVar21 = (pIVar10->SettingsWindows).Buf.Data;
      if (pcVar21 != (char *)0x0) {
        p = (ImGuiWindowSettings *)(pcVar21 + 4);
        do {
          Text("0x%08X \"%s\" Pos (%d,%d) Size (%d,%d) Collapsed=%d",(ulong)p->ID,p + 1,
               (ulong)(uint)(int)(p->Pos).x,(ulong)(uint)(int)(p->Pos).y,
               (ulong)(uint)(int)(p->Size).x,(ulong)(uint)(int)(p->Size).y,(ulong)p->Collapsed);
          p = ImChunkStream<ImGuiWindowSettings>::next_chunk(&pIVar10->SettingsWindows,p);
        } while (p != (ImGuiWindowSettings *)0x0);
      }
      TreePop();
    }
    bVar13 = TreeNode("SettingsTables","Settings packed data: Tables: %d bytes",
                      (ulong)(uint)(pIVar10->SettingsTables).Buf.Size);
    if (bVar13) {
      pcVar21 = (pIVar10->SettingsTables).Buf.Data;
      if (pcVar21 != (char *)0x0) {
        settings = (ImGuiTableSettings *)(pcVar21 + 4);
        do {
          DebugNodeTableSettings(settings);
          settings = ImChunkStream<ImGuiTableSettings>::next_chunk
                               (&pIVar10->SettingsTables,settings);
        } while (settings != (ImGuiTableSettings *)0x0);
      }
      TreePop();
    }
    iVar23 = (pIVar10->SettingsIniData).Buf.Size;
    uVar22 = (ulong)(iVar23 - 1);
    if (iVar23 == 0) {
      uVar22 = 0;
    }
    bVar13 = TreeNode("SettingsIniData","Settings unpacked data (.ini): %d bytes",uVar22);
    if (bVar13) {
      pcVar21 = (pIVar10->SettingsIniData).Buf.Data;
      pcVar19 = ImGuiTextBuffer::EmptyString;
      if (pcVar21 != (char *)0x0) {
        pcVar19 = pcVar21;
      }
      buf_1._4_4_ = GImGui->FontSize * 20.0;
      buf_1[0] = '\0';
      buf_1[1] = '\0';
      buf_1[2] = -0x80;
      buf_1[3] = -0x80;
      InputTextMultiline("##Ini",pcVar19,(long)(pIVar10->SettingsIniData).Buf.Size,(ImVec2 *)buf_1,
                         0x4000,(ImGuiInputTextCallback)0x0,(void *)0x0);
      TreePop();
    }
    TreePop();
  }
  bVar13 = TreeNode("Internal state");
  if (!bVar13) {
LAB_00146d82:
    local_1b8._0_8_ = &pIVar10->Tables;
    if ((((pIVar10->DebugMetricsConfig).ShowWindowsRects != false) ||
        ((pIVar10->DebugMetricsConfig).ShowWindowsBeginOrder == true)) &&
       (0 < *(int *)local_1c8._0_8_)) {
      lVar18 = 0;
      do {
        pIVar5 = (pIVar10->Windows).Data[lVar18];
        if (pIVar5->WasActive == true) {
          pIVar15 = GetForegroundDrawList();
          if ((pIVar10->DebugMetricsConfig).ShowWindowsRects == true) {
            buf_1._0_16_ = (undefined1  [16])
                           ShowMetricsWindow::Funcs::GetWindowRect(pIVar5,*local_1a8);
            ImDrawList::AddRect(pIVar15,(ImVec2 *)buf_1,(ImVec2 *)(buf_1 + 8),0xff8000ff,0.0,0,1.0);
          }
          if (((pIVar10->DebugMetricsConfig).ShowWindowsBeginOrder == true) &&
             ((pIVar5->Flags & 0x1000000) == 0)) {
            ImFormatString(buf_1,0x20,"%d",(ulong)(uint)(int)pIVar5->BeginOrderWithinContext);
            local_1d8.x = (pIVar5->Pos).x + GImGui->FontSize;
            local_1d8.y = GImGui->FontSize + (pIVar5->Pos).y;
            ImDrawList::AddRectFilled(pIVar15,&pIVar5->Pos,&local_1d8,0xff6464c8,0.0,0);
            ImDrawList::AddText(pIVar15,&pIVar5->Pos,0xffffffff,buf_1,(char *)0x0);
          }
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 < *(int *)local_1c8._0_8_);
    }
    if (((pIVar10->DebugMetricsConfig).ShowTablesRects == true) &&
       (0 < (pIVar10->Tables).Map.Data.Size)) {
      iVar23 = 0;
      do {
        pIVar14 = ImPool<ImGuiTable>::TryGetMapData((ImPool<ImGuiTable> *)local_1b8._0_8_,iVar23);
        if ((pIVar14 != (ImGuiTable *)0x0) && (pIVar10->FrameCount + -1 <= pIVar14->LastFrameActive)
           ) {
          pIVar15 = GetForegroundDrawList();
          if (*local_1d0 < 6) {
            buf_1._0_16_ = (undefined1  [16])
                           ShowMetricsWindow::Funcs::GetTableRect(pIVar14,*local_1d0,-1);
            ImDrawList::AddRect(pIVar15,(ImVec2 *)buf_1,(ImVec2 *)(buf_1 + 8),0xff8000ff,0.0,0,1.0);
          }
          else if (0 < pIVar14->ColumnsCount) {
            iVar27 = 0;
            do {
              buf_1._0_16_ = (undefined1  [16])
                             ShowMetricsWindow::Funcs::GetTableRect(pIVar14,*local_1d0,iVar27);
              bVar13 = iVar27 == pIVar14->HoveredColumnBody;
              col = 0xff8000ff;
              if (bVar13) {
                col = 0xff80ffff;
              }
              ImDrawList::AddRect(pIVar15,(ImVec2 *)buf_1,(ImVec2 *)(buf_1 + 8),col,0.0,0,
                                  *(float *)(&DAT_001ac198 + (ulong)bVar13 * 4));
              iVar27 = iVar27 + 1;
            } while (iVar27 < pIVar14->ColumnsCount);
          }
        }
        iVar23 = iVar23 + 1;
      } while (iVar23 < (pIVar10->Tables).Map.Data.Size);
    }
    End();
    return;
  }
  Text("WINDOWING");
  pIVar11 = GImGui;
  pIVar5 = GImGui->CurrentWindow;
  pIVar5->WriteAccessed = true;
  fVar33 = (pIVar11->Style).IndentSpacing + (pIVar5->DC).Indent.x;
  (pIVar5->DC).Indent.x = fVar33;
  (pIVar5->DC).CursorPos.x = fVar33 + (pIVar5->Pos).x + (pIVar5->DC).ColumnsOffset.x;
  pcVar19 = "NULL";
  pcVar21 = "NULL";
  if (pIVar10->HoveredWindow != (ImGuiWindow *)0x0) {
    pcVar21 = pIVar10->HoveredWindow->Name;
  }
  Text("HoveredWindow: \'%s\'",pcVar21);
  pcVar21 = "NULL";
  if (pIVar10->HoveredWindow != (ImGuiWindow *)0x0) {
    pcVar21 = pIVar10->HoveredWindow->RootWindow->Name;
  }
  Text("HoveredWindow->Root: \'%s\'",pcVar21);
  pcVar21 = "NULL";
  if (pIVar10->HoveredWindowUnderMovingWindow != (ImGuiWindow *)0x0) {
    pcVar21 = pIVar10->HoveredWindowUnderMovingWindow->Name;
  }
  Text("HoveredWindowUnderMovingWindow: \'%s\'",pcVar21);
  if (pIVar10->MovingWindow != (ImGuiWindow *)0x0) {
    pcVar19 = pIVar10->MovingWindow->Name;
  }
  Text("MovingWindow: \'%s\'",pcVar19);
  pIVar11 = GImGui;
  pIVar5 = GImGui->CurrentWindow;
  pIVar5->WriteAccessed = true;
  fVar33 = (pIVar5->DC).Indent.x - (pIVar11->Style).IndentSpacing;
  (pIVar5->DC).Indent.x = fVar33;
  (pIVar5->DC).CursorPos.x = fVar33 + (pIVar5->Pos).x + (pIVar5->DC).ColumnsOffset.x;
  Text("ITEMS");
  pIVar11 = GImGui;
  pIVar5 = GImGui->CurrentWindow;
  pIVar5->WriteAccessed = true;
  fVar33 = (pIVar11->Style).IndentSpacing + (pIVar5->DC).Indent.x;
  (pIVar5->DC).Indent.x = fVar33;
  (pIVar5->DC).CursorPos.x = fVar33 + (pIVar5->Pos).x + (pIVar5->DC).ColumnsOffset.x;
  if ((ulong)pIVar10->ActiveIdSource < 6) {
    Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s",
         SUB84((double)pIVar10->ActiveIdTimer,0),(ulong)pIVar10->ActiveId,
         (ulong)pIVar10->ActiveIdPreviousFrame,(ulong)pIVar10->ActiveIdAllowOverlap,
         *(undefined8 *)(&DAT_001e43e0 + (ulong)pIVar10->ActiveIdSource * 8));
    if (pIVar10->ActiveIdWindow == (ImGuiWindow *)0x0) {
      pcVar21 = "NULL";
    }
    else {
      pcVar21 = pIVar10->ActiveIdWindow->Name;
    }
    uVar29 = 0;
    Text("ActiveIdWindow: \'%s\'",pcVar21);
    iVar23 = 0x200;
    do {
      bVar13 = ImBitArray<133,_-512>::operator[](&pIVar10->ActiveIdUsingKeyInputMask,iVar23);
      uVar29 = uVar29 + bVar13;
      iVar23 = iVar23 + 1;
    } while (iVar23 != 0x285);
    Text("ActiveIdUsing: Wheel: %d, NavDirMask: %X, NavInputMask: %X, KeyInputMask: %d key(s)",
         (ulong)pIVar10->ActiveIdUsingMouseWheel,(ulong)pIVar10->ActiveIdUsingNavDirMask,
         (ulong)pIVar10->ActiveIdUsingNavInputMask,(ulong)uVar29);
    Text("HoveredId: 0x%08X (%.2f sec), AllowOverlap: %d",SUB84((double)pIVar10->HoveredIdTimer,0),
         (ulong)pIVar10->HoveredIdPreviousFrame,(ulong)pIVar10->HoveredIdAllowOverlap);
    Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)",(ulong)pIVar10->DragDropActive
         ,(ulong)(pIVar10->DragDropPayload).SourceId,(pIVar10->DragDropPayload).DataType,
         (ulong)(uint)(pIVar10->DragDropPayload).DataSize);
    pIVar11 = GImGui;
    pIVar5 = GImGui->CurrentWindow;
    pIVar5->WriteAccessed = true;
    fVar33 = (pIVar5->DC).Indent.x - (pIVar11->Style).IndentSpacing;
    (pIVar5->DC).Indent.x = fVar33;
    (pIVar5->DC).CursorPos.x = fVar33 + (pIVar5->Pos).x + (pIVar5->DC).ColumnsOffset.x;
    Text("NAV,FOCUS");
    pIVar11 = GImGui;
    pIVar5 = GImGui->CurrentWindow;
    pIVar5->WriteAccessed = true;
    fVar33 = (pIVar11->Style).IndentSpacing + (pIVar5->DC).Indent.x;
    (pIVar5->DC).Indent.x = fVar33;
    (pIVar5->DC).CursorPos.x = fVar33 + (pIVar5->Pos).x + (pIVar5->DC).ColumnsOffset.x;
    if (pIVar10->NavWindow == (ImGuiWindow *)0x0) {
      pcVar21 = "NULL";
    }
    else {
      pcVar21 = pIVar10->NavWindow->Name;
    }
    Text("NavWindow: \'%s\'",pcVar21);
    Text("NavId: 0x%08X, NavLayer: %d",(ulong)pIVar10->NavId,(ulong)pIVar10->NavLayer);
    if ((ulong)pIVar10->NavInputSource < 6) {
      Text("NavInputSource: %s",*(undefined8 *)(&DAT_001e43e0 + (ulong)pIVar10->NavInputSource * 8))
      ;
      Text("NavActive: %d, NavVisible: %d",(ulong)(pIVar10->IO).NavActive,
           (ulong)(pIVar10->IO).NavVisible);
      Text("NavActivateId/DownId/PressedId/InputId: %08X/%08X/%08X/%08X",
           (ulong)pIVar10->NavActivateId,(ulong)pIVar10->NavActivateDownId,
           (ulong)pIVar10->NavActivatePressedId);
      Text("NavActivateFlags: %04X",(ulong)(uint)pIVar10->NavActivateFlags);
      Text("NavDisableHighlight: %d, NavDisableMouseHover: %d",(ulong)pIVar10->NavDisableHighlight,
           (ulong)pIVar10->NavDisableMouseHover);
      Text("NavFocusScopeId = 0x%08X",(ulong)pIVar10->NavFocusScopeId);
      if (pIVar10->NavWindowingTarget == (ImGuiWindow *)0x0) {
        pcVar21 = "NULL";
      }
      else {
        pcVar21 = pIVar10->NavWindowingTarget->Name;
      }
      Text("NavWindowingTarget: \'%s\'",pcVar21);
      pIVar11 = GImGui;
      pIVar5 = GImGui->CurrentWindow;
      pIVar5->WriteAccessed = true;
      fVar33 = (pIVar5->DC).Indent.x - (pIVar11->Style).IndentSpacing;
      (pIVar5->DC).Indent.x = fVar33;
      (pIVar5->DC).CursorPos.x = fVar33 + (pIVar5->Pos).x + (pIVar5->DC).ColumnsOffset.x;
      TreePop();
      goto LAB_00146d82;
    }
  }
  __assert_fail("((int)(sizeof(input_source_names) / sizeof(*(input_source_names)))) == ImGuiInputSource_COUNT && source >= 0 && source < ImGuiInputSource_COUNT"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O1/_deps/imgui-src/imgui.cpp"
                ,0x1ea9,"const char *GetInputSourceName(ImGuiInputSource)");
}

Assistant:

void ImGui::ShowMetricsWindow(bool* p_open)
{
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;
    ImGuiMetricsConfig* cfg = &g.DebugMetricsConfig;
    if (cfg->ShowDebugLog)
        ShowDebugLogWindow(&cfg->ShowDebugLog);
    if (cfg->ShowStackTool)
        ShowStackToolWindow(&cfg->ShowStackTool);

    if (!Begin("Dear ImGui Metrics/Debugger", p_open) || GetCurrentWindow()->BeginCount > 1)
    {
        End();
        return;
    }

    // Basic info
    Text("Dear ImGui %s", GetVersion());
    Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / io.Framerate, io.Framerate);
    Text("%d vertices, %d indices (%d triangles)", io.MetricsRenderVertices, io.MetricsRenderIndices, io.MetricsRenderIndices / 3);
    Text("%d visible windows, %d active allocations", io.MetricsRenderWindows, io.MetricsActiveAllocations);
    //SameLine(); if (SmallButton("GC")) { g.GcCompactAll = true; }

    Separator();

    // Debugging enums
    enum { WRT_OuterRect, WRT_OuterRectClipped, WRT_InnerRect, WRT_InnerClipRect, WRT_WorkRect, WRT_Content, WRT_ContentIdeal, WRT_ContentRegionRect, WRT_Count }; // Windows Rect Type
    const char* wrt_rects_names[WRT_Count] = { "OuterRect", "OuterRectClipped", "InnerRect", "InnerClipRect", "WorkRect", "Content", "ContentIdeal", "ContentRegionRect" };
    enum { TRT_OuterRect, TRT_InnerRect, TRT_WorkRect, TRT_HostClipRect, TRT_InnerClipRect, TRT_BackgroundClipRect, TRT_ColumnsRect, TRT_ColumnsWorkRect, TRT_ColumnsClipRect, TRT_ColumnsContentHeadersUsed, TRT_ColumnsContentHeadersIdeal, TRT_ColumnsContentFrozen, TRT_ColumnsContentUnfrozen, TRT_Count }; // Tables Rect Type
    const char* trt_rects_names[TRT_Count] = { "OuterRect", "InnerRect", "WorkRect", "HostClipRect", "InnerClipRect", "BackgroundClipRect", "ColumnsRect", "ColumnsWorkRect", "ColumnsClipRect", "ColumnsContentHeadersUsed", "ColumnsContentHeadersIdeal", "ColumnsContentFrozen", "ColumnsContentUnfrozen" };
    if (cfg->ShowWindowsRectsType < 0)
        cfg->ShowWindowsRectsType = WRT_WorkRect;
    if (cfg->ShowTablesRectsType < 0)
        cfg->ShowTablesRectsType = TRT_WorkRect;

    struct Funcs
    {
        static ImRect GetTableRect(ImGuiTable* table, int rect_type, int n)
        {
            ImGuiTableInstanceData* table_instance = TableGetInstanceData(table, table->InstanceCurrent); // Always using last submitted instance
            if (rect_type == TRT_OuterRect)                     { return table->OuterRect; }
            else if (rect_type == TRT_InnerRect)                { return table->InnerRect; }
            else if (rect_type == TRT_WorkRect)                 { return table->WorkRect; }
            else if (rect_type == TRT_HostClipRect)             { return table->HostClipRect; }
            else if (rect_type == TRT_InnerClipRect)            { return table->InnerClipRect; }
            else if (rect_type == TRT_BackgroundClipRect)       { return table->BgClipRect; }
            else if (rect_type == TRT_ColumnsRect)              { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->MinX, table->InnerClipRect.Min.y, c->MaxX, table->InnerClipRect.Min.y + table_instance->LastOuterHeight); }
            else if (rect_type == TRT_ColumnsWorkRect)          { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->WorkRect.Min.y, c->WorkMaxX, table->WorkRect.Max.y); }
            else if (rect_type == TRT_ColumnsClipRect)          { ImGuiTableColumn* c = &table->Columns[n]; return c->ClipRect; }
            else if (rect_type == TRT_ColumnsContentHeadersUsed){ ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersUsed, table->InnerClipRect.Min.y + table_instance->LastFirstRowHeight); } // Note: y1/y2 not always accurate
            else if (rect_type == TRT_ColumnsContentHeadersIdeal){ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersIdeal, table->InnerClipRect.Min.y + table_instance->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentFrozen)     { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXFrozen, table->InnerClipRect.Min.y + table_instance->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentUnfrozen)   { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y + table_instance->LastFirstRowHeight, c->ContentMaxXUnfrozen, table->InnerClipRect.Max.y); }
            IM_ASSERT(0);
            return ImRect();
        }

        static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Content)       { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentIdeal)         { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSizeIdeal); }
            else if (rect_type == WRT_ContentRegionRect)    { return window->ContentRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }
    };

    // Tools
    if (TreeNode("Tools"))
    {
        bool show_encoding_viewer = TreeNode("UTF-8 Encoding viewer");
        SameLine();
        MetricsHelpMarker("You can also call ImGui::DebugTextEncoding() from your code with a given string to test that your UTF-8 encoding settings are correct.");
        if (show_encoding_viewer)
        {
            static char buf[100] = "";
            SetNextItemWidth(-FLT_MIN);
            InputText("##Text", buf, IM_ARRAYSIZE(buf));
            if (buf[0] != 0)
                DebugTextEncoding(buf);
            TreePop();
        }

        // The Item Picker tool is super useful to visually select an item and break into the call-stack of where it was submitted.
        if (Checkbox("Show Item Picker", &g.DebugItemPickerActive) && g.DebugItemPickerActive)
            DebugStartItemPicker();
        SameLine();
        MetricsHelpMarker("Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don't have a debugger attached, this will probably crash.");

        // Stack Tool is your best friend!
        Checkbox("Show Debug Log", &cfg->ShowDebugLog);
        SameLine();
        MetricsHelpMarker("You can also call ImGui::ShowDebugLogWindow() from your code.");

        // Stack Tool is your best friend!
        Checkbox("Show Stack Tool", &cfg->ShowStackTool);
        SameLine();
        MetricsHelpMarker("You can also call ImGui::ShowStackToolWindow() from your code.");

        Checkbox("Show windows begin order", &cfg->ShowWindowsBeginOrder);
        Checkbox("Show windows rectangles", &cfg->ShowWindowsRects);
        SameLine();
        SetNextItemWidth(GetFontSize() * 12);
        cfg->ShowWindowsRects |= Combo("##show_windows_rect_type", &cfg->ShowWindowsRectsType, wrt_rects_names, WRT_Count, WRT_Count);
        if (cfg->ShowWindowsRects && g.NavWindow != NULL)
        {
            BulletText("'%s':", g.NavWindow->Name);
            Indent();
            for (int rect_n = 0; rect_n < WRT_Count; rect_n++)
            {
                ImRect r = Funcs::GetWindowRect(g.NavWindow, rect_n);
                Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), wrt_rects_names[rect_n]);
            }
            Unindent();
        }

        Checkbox("Show tables rectangles", &cfg->ShowTablesRects);
        SameLine();
        SetNextItemWidth(GetFontSize() * 12);
        cfg->ShowTablesRects |= Combo("##show_table_rects_type", &cfg->ShowTablesRectsType, trt_rects_names, TRT_Count, TRT_Count);
        if (cfg->ShowTablesRects && g.NavWindow != NULL)
        {
            for (int table_n = 0; table_n < g.Tables.GetMapSize(); table_n++)
            {
                ImGuiTable* table = g.Tables.TryGetMapData(table_n);
                if (table == NULL || table->LastFrameActive < g.FrameCount - 1 || (table->OuterWindow != g.NavWindow && table->InnerWindow != g.NavWindow))
                    continue;

                BulletText("Table 0x%08X (%d columns, in '%s')", table->ID, table->ColumnsCount, table->OuterWindow->Name);
                if (IsItemHovered())
                    GetForegroundDrawList()->AddRect(table->OuterRect.Min - ImVec2(1, 1), table->OuterRect.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, 0, 2.0f);
                Indent();
                char buf[128];
                for (int rect_n = 0; rect_n < TRT_Count; rect_n++)
                {
                    if (rect_n >= TRT_ColumnsRect)
                    {
                        if (rect_n != TRT_ColumnsRect && rect_n != TRT_ColumnsClipRect)
                            continue;
                        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                        {
                            ImRect r = Funcs::GetTableRect(table, rect_n, column_n);
                            ImFormatString(buf, IM_ARRAYSIZE(buf), "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) Col %d %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), column_n, trt_rects_names[rect_n]);
                            Selectable(buf);
                            if (IsItemHovered())
                                GetForegroundDrawList()->AddRect(r.Min - ImVec2(1, 1), r.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, 0, 2.0f);
                        }
                    }
                    else
                    {
                        ImRect r = Funcs::GetTableRect(table, rect_n, -1);
                        ImFormatString(buf, IM_ARRAYSIZE(buf), "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), trt_rects_names[rect_n]);
                        Selectable(buf);
                        if (IsItemHovered())
                            GetForegroundDrawList()->AddRect(r.Min - ImVec2(1, 1), r.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, 0, 2.0f);
                    }
                }
                Unindent();
            }
        }

        TreePop();
    }

    // Windows
    if (TreeNode("Windows", "Windows (%d)", g.Windows.Size))
    {
        //SetNextItemOpen(true, ImGuiCond_Once);
        DebugNodeWindowsList(&g.Windows, "By display order");
        DebugNodeWindowsList(&g.WindowsFocusOrder, "By focus order (root windows)");
        if (TreeNode("By submission order (begin stack)"))
        {
            // Here we display windows in their submitted order/hierarchy, however note that the Begin stack doesn't constitute a Parent<>Child relationship!
            ImVector<ImGuiWindow*>& temp_buffer = g.WindowsTempSortBuffer;
            temp_buffer.resize(0);
            for (int i = 0; i < g.Windows.Size; i++)
                if (g.Windows[i]->LastFrameActive + 1 >= g.FrameCount)
                    temp_buffer.push_back(g.Windows[i]);
            struct Func { static int IMGUI_CDECL WindowComparerByBeginOrder(const void* lhs, const void* rhs) { return ((int)(*(const ImGuiWindow* const *)lhs)->BeginOrderWithinContext - (*(const ImGuiWindow* const*)rhs)->BeginOrderWithinContext); } };
            ImQsort(temp_buffer.Data, (size_t)temp_buffer.Size, sizeof(ImGuiWindow*), Func::WindowComparerByBeginOrder);
            DebugNodeWindowsListByBeginStackParent(temp_buffer.Data, temp_buffer.Size, NULL);
            TreePop();
        }

        TreePop();
    }

    // DrawLists
    int drawlist_count = 0;
    for (int viewport_i = 0; viewport_i < g.Viewports.Size; viewport_i++)
        drawlist_count += g.Viewports[viewport_i]->DrawDataBuilder.GetDrawListCount();
    if (TreeNode("DrawLists", "DrawLists (%d)", drawlist_count))
    {
        Checkbox("Show ImDrawCmd mesh when hovering", &cfg->ShowDrawCmdMesh);
        Checkbox("Show ImDrawCmd bounding boxes when hovering", &cfg->ShowDrawCmdBoundingBoxes);
        for (int viewport_i = 0; viewport_i < g.Viewports.Size; viewport_i++)
        {
            ImGuiViewportP* viewport = g.Viewports[viewport_i];
            for (int layer_i = 0; layer_i < IM_ARRAYSIZE(viewport->DrawDataBuilder.Layers); layer_i++)
                for (int draw_list_i = 0; draw_list_i < viewport->DrawDataBuilder.Layers[layer_i].Size; draw_list_i++)
                    DebugNodeDrawList(NULL, viewport->DrawDataBuilder.Layers[layer_i][draw_list_i], "DrawList");
        }
        TreePop();
    }

    // Viewports
    if (TreeNode("Viewports", "Viewports (%d)", g.Viewports.Size))
    {
        Indent(GetTreeNodeToLabelSpacing());
        RenderViewportsThumbnails();
        Unindent(GetTreeNodeToLabelSpacing());
        for (int i = 0; i < g.Viewports.Size; i++)
            DebugNodeViewport(g.Viewports[i]);
        TreePop();
    }

    // Details for Popups
    if (TreeNode("Popups", "Popups (%d)", g.OpenPopupStack.Size))
    {
        for (int i = 0; i < g.OpenPopupStack.Size; i++)
        {
            ImGuiWindow* window = g.OpenPopupStack[i].Window;
            BulletText("PopupID: %08x, Window: '%s'%s%s", g.OpenPopupStack[i].PopupId, window ? window->Name : "NULL", window && (window->Flags & ImGuiWindowFlags_ChildWindow) ? " ChildWindow" : "", window && (window->Flags & ImGuiWindowFlags_ChildMenu) ? " ChildMenu" : "");
        }
        TreePop();
    }

    // Details for TabBars
    if (TreeNode("TabBars", "Tab Bars (%d)", g.TabBars.GetAliveCount()))
    {
        for (int n = 0; n < g.TabBars.GetMapSize(); n++)
            if (ImGuiTabBar* tab_bar = g.TabBars.TryGetMapData(n))
            {
                PushID(tab_bar);
                DebugNodeTabBar(tab_bar, "TabBar");
                PopID();
            }
        TreePop();
    }

    // Details for Tables
    if (TreeNode("Tables", "Tables (%d)", g.Tables.GetAliveCount()))
    {
        for (int n = 0; n < g.Tables.GetMapSize(); n++)
            if (ImGuiTable* table = g.Tables.TryGetMapData(n))
                DebugNodeTable(table);
        TreePop();
    }

    // Details for Fonts
    ImFontAtlas* atlas = g.IO.Fonts;
    if (TreeNode("Fonts", "Fonts (%d)", atlas->Fonts.Size))
    {
        ShowFontAtlas(atlas);
        TreePop();
    }

    // Details for InputText
    if (TreeNode("InputText"))
    {
        DebugNodeInputTextState(&g.InputTextState);
        TreePop();
    }

    // Details for Docking
#ifdef IMGUI_HAS_DOCK
    if (TreeNode("Docking"))
    {
        TreePop();
    }
#endif // #ifdef IMGUI_HAS_DOCK

    // Settings
    if (TreeNode("Settings"))
    {
        if (SmallButton("Clear"))
            ClearIniSettings();
        SameLine();
        if (SmallButton("Save to memory"))
            SaveIniSettingsToMemory();
        SameLine();
        if (SmallButton("Save to disk"))
            SaveIniSettingsToDisk(g.IO.IniFilename);
        SameLine();
        if (g.IO.IniFilename)
            Text("\"%s\"", g.IO.IniFilename);
        else
            TextUnformatted("<NULL>");
        Text("SettingsDirtyTimer %.2f", g.SettingsDirtyTimer);
        if (TreeNode("SettingsHandlers", "Settings handlers: (%d)", g.SettingsHandlers.Size))
        {
            for (int n = 0; n < g.SettingsHandlers.Size; n++)
                BulletText("%s", g.SettingsHandlers[n].TypeName);
            TreePop();
        }
        if (TreeNode("SettingsWindows", "Settings packed data: Windows: %d bytes", g.SettingsWindows.size()))
        {
            for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
                DebugNodeWindowSettings(settings);
            TreePop();
        }

        if (TreeNode("SettingsTables", "Settings packed data: Tables: %d bytes", g.SettingsTables.size()))
        {
            for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
                DebugNodeTableSettings(settings);
            TreePop();
        }

#ifdef IMGUI_HAS_DOCK
#endif // #ifdef IMGUI_HAS_DOCK

        if (TreeNode("SettingsIniData", "Settings unpacked data (.ini): %d bytes", g.SettingsIniData.size()))
        {
            InputTextMultiline("##Ini", (char*)(void*)g.SettingsIniData.c_str(), g.SettingsIniData.Buf.Size, ImVec2(-FLT_MIN, GetTextLineHeight() * 20), ImGuiInputTextFlags_ReadOnly);
            TreePop();
        }
        TreePop();
    }

    // Misc Details
    if (TreeNode("Internal state"))
    {
        Text("WINDOWING");
        Indent();
        Text("HoveredWindow: '%s'", g.HoveredWindow ? g.HoveredWindow->Name : "NULL");
        Text("HoveredWindow->Root: '%s'", g.HoveredWindow ? g.HoveredWindow->RootWindow->Name : "NULL");
        Text("HoveredWindowUnderMovingWindow: '%s'", g.HoveredWindowUnderMovingWindow ? g.HoveredWindowUnderMovingWindow->Name : "NULL");
        Text("MovingWindow: '%s'", g.MovingWindow ? g.MovingWindow->Name : "NULL");
        Unindent();

        Text("ITEMS");
        Indent();
        Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s", g.ActiveId, g.ActiveIdPreviousFrame, g.ActiveIdTimer, g.ActiveIdAllowOverlap, GetInputSourceName(g.ActiveIdSource));
        Text("ActiveIdWindow: '%s'", g.ActiveIdWindow ? g.ActiveIdWindow->Name : "NULL");

        int active_id_using_key_input_count = 0;
        for (int n = ImGuiKey_NamedKey_BEGIN; n < ImGuiKey_NamedKey_END; n++)
            active_id_using_key_input_count += g.ActiveIdUsingKeyInputMask[n] ? 1 : 0;
        Text("ActiveIdUsing: Wheel: %d, NavDirMask: %X, NavInputMask: %X, KeyInputMask: %d key(s)", g.ActiveIdUsingMouseWheel, g.ActiveIdUsingNavDirMask, g.ActiveIdUsingNavInputMask, active_id_using_key_input_count);
        Text("HoveredId: 0x%08X (%.2f sec), AllowOverlap: %d", g.HoveredIdPreviousFrame, g.HoveredIdTimer, g.HoveredIdAllowOverlap); // Not displaying g.HoveredId as it is update mid-frame
        Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)", g.DragDropActive, g.DragDropPayload.SourceId, g.DragDropPayload.DataType, g.DragDropPayload.DataSize);
        Unindent();

        Text("NAV,FOCUS");
        Indent();
        Text("NavWindow: '%s'", g.NavWindow ? g.NavWindow->Name : "NULL");
        Text("NavId: 0x%08X, NavLayer: %d", g.NavId, g.NavLayer);
        Text("NavInputSource: %s", GetInputSourceName(g.NavInputSource));
        Text("NavActive: %d, NavVisible: %d", g.IO.NavActive, g.IO.NavVisible);
        Text("NavActivateId/DownId/PressedId/InputId: %08X/%08X/%08X/%08X", g.NavActivateId, g.NavActivateDownId, g.NavActivatePressedId, g.NavActivateInputId);
        Text("NavActivateFlags: %04X", g.NavActivateFlags);
        Text("NavDisableHighlight: %d, NavDisableMouseHover: %d", g.NavDisableHighlight, g.NavDisableMouseHover);
        Text("NavFocusScopeId = 0x%08X", g.NavFocusScopeId);
        Text("NavWindowingTarget: '%s'", g.NavWindowingTarget ? g.NavWindowingTarget->Name : "NULL");
        Unindent();

        TreePop();
    }

    // Overlay: Display windows Rectangles and Begin Order
    if (cfg->ShowWindowsRects || cfg->ShowWindowsBeginOrder)
    {
        for (int n = 0; n < g.Windows.Size; n++)
        {
            ImGuiWindow* window = g.Windows[n];
            if (!window->WasActive)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(window);
            if (cfg->ShowWindowsRects)
            {
                ImRect r = Funcs::GetWindowRect(window, cfg->ShowWindowsRectsType);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
            if (cfg->ShowWindowsBeginOrder && !(window->Flags & ImGuiWindowFlags_ChildWindow))
            {
                char buf[32];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "%d", window->BeginOrderWithinContext);
                float font_size = GetFontSize();
                draw_list->AddRectFilled(window->Pos, window->Pos + ImVec2(font_size, font_size), IM_COL32(200, 100, 100, 255));
                draw_list->AddText(window->Pos, IM_COL32(255, 255, 255, 255), buf);
            }
        }
    }

    // Overlay: Display Tables Rectangles
    if (cfg->ShowTablesRects)
    {
        for (int table_n = 0; table_n < g.Tables.GetMapSize(); table_n++)
        {
            ImGuiTable* table = g.Tables.TryGetMapData(table_n);
            if (table == NULL || table->LastFrameActive < g.FrameCount - 1)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(table->OuterWindow);
            if (cfg->ShowTablesRectsType >= TRT_ColumnsRect)
            {
                for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                {
                    ImRect r = Funcs::GetTableRect(table, cfg->ShowTablesRectsType, column_n);
                    ImU32 col = (table->HoveredColumnBody == column_n) ? IM_COL32(255, 255, 128, 255) : IM_COL32(255, 0, 128, 255);
                    float thickness = (table->HoveredColumnBody == column_n) ? 3.0f : 1.0f;
                    draw_list->AddRect(r.Min, r.Max, col, 0.0f, 0, thickness);
                }
            }
            else
            {
                ImRect r = Funcs::GetTableRect(table, cfg->ShowTablesRectsType, -1);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
        }
    }

#ifdef IMGUI_HAS_DOCK
    // Overlay: Display Docking info
    if (show_docking_nodes && g.IO.KeyCtrl)
    {
    }
#endif // #ifdef IMGUI_HAS_DOCK

    End();
}